

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

void WebPConvertRGBA32ToUV_C(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  int iVar5;
  
  if (0 < width) {
    uVar4 = 0;
    do {
      uVar1 = rgb[uVar4 * 4];
      uVar2 = rgb[uVar4 * 4 + 1];
      uVar3 = rgb[uVar4 * 4 + 2];
      iVar5 = (int)((uint)uVar3 * 0x7080 + 0x2020000 + (uint)uVar2 * -0x4a89 + (uint)uVar1 * -0x25f7
                   ) >> 0x12;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      u[uVar4] = (uint8_t)iVar5;
      iVar5 = (int)((uint)uVar3 * -0x124c + 0x2020000 + (uint)uVar2 * -0x5e34 + (uint)uVar1 * 0x7080
                   ) >> 0x12;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      v[uVar4] = (uint8_t)iVar5;
      uVar4 = uVar4 + 1;
    } while ((uint)width != uVar4);
  }
  return;
}

Assistant:

void WebPConvertRGBA32ToUV_C(const uint16_t* WEBP_RESTRICT rgb,
                             uint8_t* WEBP_RESTRICT u, uint8_t* WEBP_RESTRICT v,
                             int width) {
  int i;
  for (i = 0; i < width; i += 1, rgb += 4) {
    const int r = rgb[0], g = rgb[1], b = rgb[2];
    u[i] = VP8RGBToU(r, g, b, YUV_HALF << 2);
    v[i] = VP8RGBToV(r, g, b, YUV_HALF << 2);
  }
}